

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O2

void __thiscall
QMessageBox::QMessageBox
          (QMessageBox *this,Icon icon,QString *title,QString *text,StandardButtons buttons,
          QWidget *parent,WindowFlags f)

{
  QMessageBoxPrivate *this_00;
  
  this_00 = (QMessageBoxPrivate *)operator_new(0x3b0);
  QMessageBoxPrivate::QMessageBoxPrivate(this_00);
  QDialog::QDialog(&this->super_QDialog,(QDialogPrivate *)this_00,parent,
                   (WindowFlags)
                   ((uint)f.super_QFlagsStorageHelper<Qt::WindowType,_4>.
                          super_QFlagsStorage<Qt::WindowType>.i | 0x8003100));
  *(undefined ***)&(this->super_QDialog).super_QWidget = &PTR_metaObject_007de5b0;
  *(undefined ***)&(this->super_QDialog).super_QWidget.super_QPaintDevice =
       &PTR__QMessageBox_007de788;
  QMessageBoxPrivate::init
            (*(QMessageBoxPrivate **)&(this->super_QDialog).super_QWidget.field_0x8,
             (EVP_PKEY_CTX *)title);
  setIcon(this,icon);
  if ((QFlagsStorage<QMessageBox::StandardButton>)
      buttons.super_QFlagsStorageHelper<QMessageBox::StandardButton,_4>.
      super_QFlagsStorage<QMessageBox::StandardButton>.i !=
      (QFlagsStorage<QMessageBox::StandardButton>)0x0) {
    setStandardButtons(this,buttons);
    return;
  }
  return;
}

Assistant:

QMessageBox::QMessageBox(Icon icon, const QString &title, const QString &text,
                         StandardButtons buttons, QWidget *parent,
                         Qt::WindowFlags f)
: QDialog(*new QMessageBoxPrivate, parent, f | Qt::MSWindowsFixedSizeDialogHint | Qt::WindowTitleHint | Qt::WindowSystemMenuHint | Qt::WindowCloseButtonHint)
{
    Q_D(QMessageBox);
    d->init(title, text);
    setIcon(icon);
    if (buttons != NoButton)
        setStandardButtons(buttons);
}